

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O3

int FindUnixPipes(void)

{
  unixjob *puVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  
  UnixPID = -1;
  StartTime = -1;
  UnixPipeOut = -1;
  UnixPipeIn = -1;
  pcVar3 = getenv("LDEPIPEIN");
  if (pcVar3 != (char *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    lVar5 = strtol(pcVar3,(char **)0x0,10);
    if (*piVar4 == 0) {
      UnixPipeIn = (int)lVar5;
    }
  }
  pcVar3 = getenv("LDEPIPEOUT");
  if (pcVar3 != (char *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    lVar5 = strtol(pcVar3,(char **)0x0,10);
    if (*piVar4 == 0) {
      UnixPipeOut = (int)lVar5;
    }
  }
  pcVar3 = getenv("LDESTARTTIME");
  if (pcVar3 != (char *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    lVar5 = strtol(pcVar3,(char **)0x0,10);
    if (*piVar4 == 0) {
      StartTime = (long)(int)lVar5;
    }
  }
  pcVar3 = getenv("LDEUNIXPID");
  if (pcVar3 != (char *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    lVar5 = strtol(pcVar3,(char **)0x0,10);
    if (*piVar4 == 0) {
      UnixPID = (int)lVar5;
    }
  }
  lVar5 = sysconf(4);
  iVar2 = (int)lVar5;
  NPROCS = iVar2;
  UJ = (unixjob *)malloc((long)iVar2 * 0x18);
  if (0 < iVar2) {
    lVar5 = 0x10;
    lVar6 = 0;
    do {
      puVar1 = UJ;
      *(undefined8 *)((long)UJ + lVar5 + -0x10) = 0;
      *(undefined8 *)((long)puVar1 + lVar5 + -8) = 0xffffffff00000000;
      *(undefined4 *)((long)&puVar1->pathname + lVar5) = 0;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x18;
    } while (lVar6 < NPROCS);
  }
  return (int)((UnixPID == -1 || StartTime == -1) || (UnixPipeOut == -1 || UnixPipeIn == -1));
}

Assistant:

int FindUnixPipes(void) {
  char *envtmp;
  int inttmp;
  struct unixjob cleareduj;

  DBPRINT(("Entering FindUnixPipes\n"));
  UnixPipeIn = UnixPipeOut = StartTime = UnixPID = -1;
  if ((envtmp = getenv("LDEPIPEIN"))) {
    errno = 0;
    inttmp = (int)strtol(envtmp, (char **)NULL, 10);
    if (errno == 0)
      UnixPipeIn = inttmp;
  }
  if ((envtmp = getenv("LDEPIPEOUT"))) {
    errno = 0;
    inttmp = (int)strtol(envtmp, (char **)NULL, 10);
    if (errno == 0)
      UnixPipeOut = inttmp;
  }
  if ((envtmp = getenv("LDESTARTTIME"))) {
    errno = 0;
    inttmp = (int)strtol(envtmp, (char **)NULL, 10);
    if (errno == 0)
      StartTime = inttmp;
  }
  if ((envtmp = getenv("LDEUNIXPID"))) {
    errno = 0;
    inttmp = (int)strtol(envtmp, (char **)NULL, 10);
    if (errno == 0)
      UnixPID = inttmp;
  }

/* This is a good place to initialize stuff like the UJ table */
  NPROCS = sysconf(_SC_OPEN_MAX);

  UJ = (struct unixjob *)malloc(NPROCS * sizeof(struct unixjob));
  cleareduj.status = -1;
  cleareduj.pathname = NULL;
  cleareduj.PID = 0;
  cleareduj.type = UJUNUSED;
  for (int i = 0; i < NPROCS; i++) UJ[i] = cleareduj;

  DBPRINT(("NPROCS is %d; leaving FindUnixPipes\n", NPROCS));
  return (UnixPipeIn == -1 || UnixPipeOut == -1 || StartTime == -1 || UnixPID == -1);
}